

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::WorkerThread(HdlcAnalyzer *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer this_00;
  
  SetupAnalyzer(this);
  if (((this->mSettings)._M_ptr)->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    ProcessHDLCFrame(this);
    CommitFrames(this);
    pFVar1 = (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = pFVar1;
    if (pFVar2 != pFVar1) {
      do {
        Frame::~Frame(this_00);
        this_00 = this_00 + 0x28;
      } while (this_00 != pFVar2);
      (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
      super__Vector_impl_data._M_finish = pFVar1;
    }
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void HdlcAnalyzer::WorkerThread()
{
    SetupAnalyzer();

    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        // Synchronize
        mHdlc->AdvanceToNextEdge();
    }

    // Main loop
    for( ;; )
    {
        ProcessHDLCFrame();

        CommitFrames();
        mResultFrames.clear();

        mResults->CommitResults();
        ReportProgress( mHdlc->GetSampleNumber() );
        CheckIfThreadShouldExit();
    }
}